

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  byte *pbVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  const_iterator cVar6;
  char *pcVar7;
  _Rb_tree_node_base *p_Var8;
  size_t sVar9;
  _Rb_tree_node_base *p_Var10;
  undefined8 extraout_RAX;
  _Rb_tree_header *p_Var11;
  char *pcVar12;
  string name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  key_type local_b8;
  TypedTestCasePState *local_98;
  uint local_8c;
  internal *local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_50;
  
  *this = (TypedTestCasePState)0x1;
  pcVar12 = registered_tests + -1;
  local_98 = this;
  local_8c = line;
  local_88 = (internal *)file;
  do {
    pbVar1 = (byte *)(pcVar12 + 1);
    pcVar12 = pcVar12 + 1;
    iVar3 = isspace((uint)*pbVar1);
  } while (iVar3 != 0);
  Message::Message((Message *)&local_c0);
  p_Var11 = &local_80._M_impl.super__Rb_tree_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var11->_M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var11->_M_header;
  if (pcVar12 != (char *)0x0) {
    p_Var10 = (_Rb_tree_node_base *)(local_98 + 0x10);
    pcVar7 = pcVar12;
    do {
      pcVar5 = strchr(pcVar7,0x2c);
      if (pcVar5 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,pcVar7,(allocator<char> *)&local_50);
      }
      else {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,pcVar7,pcVar5);
      }
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_80,&local_b8);
      p_Var11 = &local_80._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)cVar6._M_node == p_Var11) {
        for (p_Var8 = *(_Rb_tree_node_base **)(local_98 + 0x20); p_Var8 != p_Var10;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          iVar3 = std::__cxx11::string::compare((char *)&local_b8);
          if (iVar3 == 0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_80,&local_b8);
            goto LAB_00121eca;
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_c0.ptr_ + 0x10),"No test named ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_c0.ptr_ + 0x10),local_b8._M_dataplus._M_p,
                   local_b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_c0.ptr_ + 0x10)," can be found in this test case.\n",0x21);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_c0.ptr_ + 0x10),"Test ",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_c0.ptr_ + 0x10),local_b8._M_dataplus._M_p,
                   local_b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_c0.ptr_ + 0x10)," is listed more than once.\n",0x1b);
      }
LAB_00121eca:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      pcVar7 = strchr(pcVar7,0x2c);
      if (pcVar7 == (char *)0x0) break;
      do {
        pbVar1 = (byte *)(pcVar7 + 1);
        pcVar7 = pcVar7 + 1;
        iVar3 = isspace((uint)*pbVar1);
      } while (iVar3 != 0);
    } while (pcVar7 != (char *)0x0);
  }
  iVar3 = (int)p_Var11;
  p_Var10 = *(_Rb_tree_node_base **)(local_98 + 0x20);
  p_Var8 = (_Rb_tree_node_base *)(local_98 + 0x10);
  if (p_Var10 != p_Var8) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,*(char **)(p_Var10 + 1),(allocator<char> *)&local_50);
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_80,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)cVar6._M_node == &local_80._M_impl.super__Rb_tree_header) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_c0.ptr_ + 0x10),"You forgot to list test ",0x18);
        sVar2.ptr_ = local_c0.ptr_;
        pcVar7 = *(char **)(p_Var10 + 1);
        if (pcVar7 == (char *)0x0) {
          sVar9 = 6;
          pcVar7 = "(null)";
        }
        else {
          sVar9 = strlen(pcVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(sVar2.ptr_ + 0x10),pcVar7,sVar9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_c0.ptr_ + 0x10),".\n",2);
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      iVar3 = (int)p_Var11;
    } while (p_Var10 != p_Var8);
  }
  StringStreamToString(&local_b8,local_c0.ptr_);
  iVar4 = std::__cxx11::string::compare((char *)&local_b8);
  if (iVar4 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_80);
    if (local_c0.ptr_ != (stringstream *)0x0) {
      (**(code **)(*(long *)local_c0.ptr_ + 8))();
    }
    return pcVar12;
  }
  FormatFileLocation_abi_cxx11_(&local_50,local_88,(char *)(ulong)local_8c,iVar3);
  VerifyRegisteredTestNames();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_80);
  if (local_c0.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_c0.ptr_ + 8))();
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<std::string> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const std::string name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}